

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramFunctor,long>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  HistogramBinState<long> **ppHVar2;
  LogicalType *pLVar3;
  idx_t iVar4;
  size_type sVar5;
  reference pvVar6;
  reference value;
  UnifiedVectorFormat *in_RCX;
  Vector *in_RDX;
  ulong in_RDI;
  long in_R8;
  LogicalType *in_stack_00000018;
  idx_t bin_idx;
  list_entry_t *list_entry;
  HistogramBinState<long> *state_1;
  idx_t rid;
  idx_t i_1;
  idx_t current_offset;
  unsigned_long *count_entries;
  list_entry_t *list_entries;
  Vector *values;
  Vector *keys;
  HistogramBinState<long> *state;
  idx_t i;
  bool supports_other_bucket;
  idx_t new_entries;
  idx_t old_len;
  ValidityMask *mask;
  HistogramBinState<long> **states;
  UnifiedVectorFormat sdata;
  Vector *in_stack_fffffffffffffe38;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffe40;
  Vector *in_stack_fffffffffffffe48;
  Value local_148 [64];
  ulong local_108;
  list_entry_t *local_100;
  HistogramBinState<long> *local_f8;
  UnifiedVectorFormat *local_f0;
  UnifiedVectorFormat *local_e8;
  TemplatedValidityMask<unsigned_long> *local_e0;
  unsigned_long *local_d8;
  list_entry_t *local_d0;
  undefined8 local_c8;
  Vector *local_c0;
  HistogramBinState<long> *local_b8;
  UnifiedVectorFormat *local_b0;
  byte local_a1;
  long local_a0;
  TemplatedValidityMask<unsigned_long> *local_98;
  ValidityMask *local_90;
  HistogramBinState<long> **local_88;
  SelectionVector *local_70 [9];
  long local_28;
  UnifiedVectorFormat *local_20;
  Vector *local_18;
  ulong local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_70);
  duckdb::Vector::ToUnifiedFormat(local_8,local_20);
  local_88 = UnifiedVectorFormat::GetData<duckdb::HistogramBinState<long>*>
                       ((UnifiedVectorFormat *)local_70);
  local_90 = FlatVector::Validity((Vector *)0xb4afbf);
  local_98 = (TemplatedValidityMask<unsigned_long> *)duckdb::ListVector::GetListSize(local_18);
  local_a0 = 0;
  pLVar3 = Vector::GetType(local_18);
  duckdb::MapType::KeyType(pLVar3);
  local_a1 = SupportsOtherBucket((LogicalType *)in_stack_fffffffffffffe38);
  for (local_b0 = (UnifiedVectorFormat *)0x0; ppHVar2 = local_88, local_b0 < local_20;
      local_b0 = local_b0 + 1) {
    iVar4 = SelectionVector::get_index(local_70[0],(idx_t)local_b0);
    local_b8 = ppHVar2[iVar4];
    if (local_b8->bin_boundaries != (unsafe_vector<long> *)0x0) {
      sVar5 = std::vector<long,_std::allocator<long>_>::size
                        (&local_b8->bin_boundaries->super_vector<long,_std::allocator<long>_>);
      local_a0 = sVar5 + local_a0;
      pvVar6 = vector<unsigned_long,_false>::back
                         ((vector<unsigned_long,_false> *)in_stack_fffffffffffffe40);
      if ((*pvVar6 != 0) && ((local_a1 & 1) != 0)) {
        local_a0 = local_a0 + 1;
      }
    }
  }
  duckdb::ListVector::Reserve(local_18,(long)&local_98->validity_mask + local_a0);
  local_c0 = (Vector *)duckdb::MapVector::GetKeys(local_18);
  local_c8 = duckdb::MapVector::GetValues(local_18);
  local_d0 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xb4b19b);
  local_d8 = FlatVector::GetData<unsigned_long>((Vector *)0xb4b1bc);
  local_e0 = local_98;
  for (local_e8 = (UnifiedVectorFormat *)0x0; ppHVar2 = local_88, local_e8 < local_20;
      local_e8 = local_e8 + 1) {
    local_f0 = local_e8 + local_28;
    iVar4 = SelectionVector::get_index(local_70[0],(idx_t)local_e8);
    local_f8 = ppHVar2[iVar4];
    if (local_f8->bin_boundaries == (unsafe_vector<long> *)0x0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (in_stack_fffffffffffffe40,(idx_t)in_stack_fffffffffffffe38);
    }
    else {
      local_100 = local_d0 + (long)local_f0;
      local_100->offset = (uint64_t)local_e0;
      for (local_108 = 0; uVar1 = local_108,
          sVar5 = std::vector<long,_std::allocator<long>_>::size
                            (&local_f8->bin_boundaries->super_vector<long,_std::allocator<long>_>),
          uVar1 < sVar5; local_108 = local_108 + 1) {
        value = vector<long,_false>::operator[]
                          ((vector<long,_false> *)in_stack_fffffffffffffe40,
                           (size_type)in_stack_fffffffffffffe38);
        HistogramFunctor::HistogramFinalize<long>
                  ((long)value,in_stack_fffffffffffffe48,(idx_t)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffe48 =
             (Vector *)
             vector<unsigned_long,_false>::operator[]
                       ((vector<unsigned_long,_false> *)in_stack_fffffffffffffe40,
                        (size_type)in_stack_fffffffffffffe38);
        local_d8[(long)local_e0] = *(unsigned_long *)in_stack_fffffffffffffe48;
        local_e0 = (TemplatedValidityMask<unsigned_long> *)((long)&local_e0->validity_mask + 1);
      }
      pvVar6 = vector<unsigned_long,_false>::back
                         ((vector<unsigned_long,_false> *)in_stack_fffffffffffffe40);
      if ((*pvVar6 != 0) && ((local_a1 & 1) != 0)) {
        in_stack_fffffffffffffe38 = local_c0;
        in_stack_fffffffffffffe40 = local_e0;
        Vector::GetType(local_c0);
        OtherBucketValue(in_stack_00000018);
        duckdb::Vector::SetValue
                  ((ulong)in_stack_fffffffffffffe38,(Value *)in_stack_fffffffffffffe40);
        duckdb::Value::~Value(local_148);
        pvVar6 = vector<unsigned_long,_false>::back
                           ((vector<unsigned_long,_false> *)in_stack_fffffffffffffe40);
        local_d8[(long)local_e0] = *pvVar6;
        local_e0 = (TemplatedValidityMask<unsigned_long> *)((long)&local_e0->validity_mask + 1);
      }
      local_100->length = (long)local_e0 - local_100->offset;
    }
  }
  duckdb::ListVector::SetListSize(local_18,(ulong)local_e0);
  duckdb::Vector::Verify((ulong)local_18);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffe40);
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}